

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O1

void __thiscall SQVM::Raise_Error(SQVM *this,SQChar *s,...)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQSharedState *this_00;
  SQTable *pSVar3;
  char in_AL;
  size_t sVar4;
  SQChar *pSVar5;
  SQString *pSVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &vl[0].overflow_arg_area;
  local_f8 = 0x3000000010;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  sVar4 = strlen(s);
  pSVar5 = SQSharedState::GetScratchPad(this->_sharedstate,sVar4 + 100);
  vsnprintf(pSVar5,sVar4 + 100,s,&local_f8);
  this_00 = this->_sharedstate;
  pSVar5 = SQSharedState::GetScratchPad(this_00,-1);
  pSVar6 = SQString::Create(this_00,pSVar5,-1);
  pSVar3 = (this->_lasterror).super_SQObject._unVal.pTable;
  SVar2 = (this->_lasterror).super_SQObject._type;
  (this->_lasterror).super_SQObject._type = OT_STRING;
  (this->_lasterror).super_SQObject._unVal.pString = pSVar6;
  pSVar1 = &(pSVar6->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return;
}

Assistant:

void SQVM::Raise_Error(const SQChar *s, ...)
{
    va_list vl;
    va_start(vl, s);
    SQInteger buffersize = (SQInteger)scstrlen(s)+(NUMBER_MAX_CHAR*2);
    scvsprintf(_sp(sq_rsl(buffersize)),buffersize, s, vl);
    va_end(vl);
    _lasterror = SQString::Create(_ss(this),_spval,-1);
}